

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Help_View.cxx
# Opt level: O1

void __thiscall Fl_Help_View::follow_link(Fl_Help_View *this,Fl_Help_Link *linkp)

{
  uint *puVar1;
  char *src;
  char cVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  size_t sVar6;
  char target [32];
  char temp [2048];
  char dir [2048];
  char local_1048 [32];
  char local_1028 [2048];
  char local_828 [2048];
  
  if (current_view == this) {
    clear_global_selection(this);
  }
  src = linkp->name;
  fl_strlcpy(local_1048,src,0x20);
  puVar1 = &(this->super_Fl_Group).super_Fl_Widget.flags_;
  *(byte *)puVar1 = (byte)*puVar1 | 0x80;
  iVar3 = strcmp(linkp->filename,this->filename_);
  if ((iVar3 == 0) || (cVar2 = linkp->filename[0], cVar2 == '\0')) {
    if (local_1048[0] == '\0') {
      topline(this,0);
    }
    else {
      topline(this,local_1048);
    }
    goto LAB_001b671e;
  }
  pcVar5 = this->directory_;
  pcVar4 = strchr(pcVar5,0x3a);
  if ((pcVar4 == (char *)0x0) || (pcVar4 = strchr(linkp->filename,0x3a), pcVar4 != (char *)0x0)) {
    if ((cVar2 != '/') && (pcVar4 = strchr(linkp->filename,0x3a), pcVar4 == (char *)0x0)) {
      if (*pcVar5 != '\0') goto LAB_001b66a4;
      pcVar5 = local_828;
      fl_getcwd(pcVar5,0x800);
      pcVar4 = "file:%s/%s";
      goto LAB_001b66c9;
    }
    pcVar5 = local_1028;
LAB_001b6625:
    fl_strlcpy(pcVar5,linkp->filename,0x800);
  }
  else if (cVar2 == '/') {
    fl_strlcpy(local_1028,pcVar5,0x800);
    pcVar5 = strchr(pcVar5,0x3a);
    pcVar5 = strrchr(pcVar5 + 3,0x2f);
    if (pcVar5 != (char *)0x0) goto LAB_001b6625;
    fl_strlcat(local_1028,linkp->filename,0x800);
  }
  else {
LAB_001b66a4:
    pcVar4 = "%s/%s";
LAB_001b66c9:
    snprintf(local_1028,0x800,pcVar4,pcVar5,linkp);
  }
  if (*src != '\0') {
    sVar6 = strlen(local_1028);
    snprintf(local_1028 + sVar6,0x800 - sVar6,"#%s",src);
  }
  load(this,local_1028);
LAB_001b671e:
  leftline(this,0);
  return;
}

Assistant:

void Fl_Help_View::follow_link(Fl_Help_Link *linkp)
{
  char		target[32];	// Current target

  clear_selection();

  strlcpy(target, linkp->name, sizeof(target));

  set_changed();

  if (strcmp(linkp->filename, filename_) != 0 && linkp->filename[0])
  {
    char	dir[FL_PATH_MAX];	// Current directory
    char	temp[FL_PATH_MAX],	// Temporary filename
	      *tempptr;	// Pointer into temporary filename


    if (strchr(directory_, ':') != NULL &&
        strchr(linkp->filename, ':') == NULL)
    {
      if (linkp->filename[0] == '/')
      {
        strlcpy(temp, directory_, sizeof(temp));
        if ((tempptr = strrchr(strchr(directory_, ':') + 3, '/')) != NULL)
	  strlcpy(tempptr, linkp->filename, sizeof(temp));
	else
	  strlcat(temp, linkp->filename, sizeof(temp));
      }
      else
	snprintf(temp, sizeof(temp), "%s/%s", directory_, linkp->filename);
    }
    else if (linkp->filename[0] != '/' && strchr(linkp->filename, ':') == NULL)
    {
      if (directory_[0])
	snprintf(temp, sizeof(temp), "%s/%s", directory_, linkp->filename);
      else
      {
	  fl_getcwd(dir, sizeof(dir));
	snprintf(temp, sizeof(temp), "file:%s/%s", dir, linkp->filename);
      }
    }
    else
      strlcpy(temp, linkp->filename, sizeof(temp));

    if (linkp->name[0])
      snprintf(temp + strlen(temp), sizeof(temp) - strlen(temp), "#%s",
	       linkp->name);

    load(temp);
  }
  else if (target[0])
    topline(target);
  else
    topline(0);

  leftline(0);
}